

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psset.c
# Opt level: O2

void psset_maybe_remove_purge_list(psset_t *psset,hpdata_t *ps)

{
  hpdata_t *phVar1;
  hpdata_t *phVar2;
  hpdata_t *phVar3;
  byte bVar4;
  size_t sVar5;
  hpdata_t *phVar6;
  
  if (ps->h_purge_allowed == true) {
    sVar5 = psset_purge_list_ind(ps);
    phVar6 = psset->to_purge[sVar5].head.qlh_first;
    if (phVar6 == ps) {
      phVar6 = (phVar6->ql_link_purge).qre_next;
      psset->to_purge[sVar5].head.qlh_first = phVar6;
    }
    if (phVar6 == ps) {
      psset->to_purge[sVar5].head.qlh_first = (hpdata_t *)0x0;
    }
    else {
      phVar1 = (ps->ql_link_purge).qre_prev;
      phVar2 = (((ps->ql_link_purge).qre_next)->ql_link_purge).qre_prev;
      (phVar1->ql_link_purge).qre_next = phVar2;
      phVar3 = (ps->ql_link_purge).qre_next;
      (phVar3->ql_link_purge).qre_prev = phVar1;
      (ps->ql_link_purge).qre_prev = phVar2;
      (((phVar3->ql_link_purge).qre_prev)->ql_link_purge).qre_next = phVar3;
      (phVar2->ql_link_purge).qre_next = ps;
      if (phVar6 != (hpdata_t *)0x0) {
        return;
      }
    }
    bVar4 = (byte)sVar5 & 0x3f;
    psset->purge_bitmap[sVar5 >> 6] =
         psset->purge_bitmap[sVar5 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
  }
  return;
}

Assistant:

static void
psset_maybe_remove_purge_list(psset_t *psset, hpdata_t *ps) {
	/*
	 * Remove the hpdata from its purge list (if it's in one).  Even if it's
	 * going to stay in the same one, by appending it during
	 * psset_update_end, we move it to the end of its queue, so that we
	 * purge LRU within a given dirtiness bucket.
	 */
	if (hpdata_purge_allowed_get(ps)) {
		size_t ind = psset_purge_list_ind(ps);
		hpdata_purge_list_t *purge_list = &psset->to_purge[ind];
		hpdata_purge_list_remove(purge_list, ps);
		if (hpdata_purge_list_empty(purge_list)) {
			fb_unset(psset->purge_bitmap, PSSET_NPURGE_LISTS, ind);
		}
	}
}